

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O0

Rule * Parser::getLCP(Rule *__return_storage_ptr__,Rule *a,Rule *b)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  const_reference b_00;
  int local_3c;
  int i;
  Rule *b_local;
  Rule *a_local;
  Rule *res;
  
  Rule::Rule(__return_storage_ptr__);
  std::vector<Parser::Node,_std::allocator<Parser::Node>_>::clear(&__return_storage_ptr__->rights);
  bVar1 = Rule::isNone(a);
  if ((!bVar1) && (bVar1 = Rule::isNone(b), !bVar1)) {
    local_3c = 0;
    while( true ) {
      sVar2 = std::vector<Parser::Node,_std::allocator<Parser::Node>_>::size(&a->rights);
      bVar1 = false;
      if ((ulong)(long)local_3c < sVar2) {
        sVar2 = std::vector<Parser::Node,_std::allocator<Parser::Node>_>::size(&b->rights);
        bVar1 = (ulong)(long)local_3c < sVar2;
      }
      if (!bVar1) break;
      pvVar3 = std::vector<Parser::Node,_std::allocator<Parser::Node>_>::operator[]
                         (&a->rights,(long)local_3c);
      b_00 = std::vector<Parser::Node,_std::allocator<Parser::Node>_>::operator[]
                       (&b->rights,(long)local_3c);
      bVar1 = Node::operator==(pvVar3,b_00);
      if (!bVar1) {
        return __return_storage_ptr__;
      }
      pvVar3 = std::vector<Parser::Node,_std::allocator<Parser::Node>_>::operator[]
                         (&a->rights,(long)local_3c);
      std::vector<Parser::Node,_std::allocator<Parser::Node>_>::push_back
                (&__return_storage_ptr__->rights,pvVar3);
      local_3c = local_3c + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Rule getLCP(const Rule& a,const Rule& b){
        Rule res;
        res.rights.clear();
        if(a.isNone()||b.isNone()) return res;
        for(int i = 0;i < a.rights.size() && i < b.rights.size();i++){
            if(a.rights[i] == b.rights[i]) res.rights.push_back(a.rights[i]);
            else break;
        }
        return res;
    }